

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTryRunCommand.cxx
# Opt level: O2

void __thiscall
cmTryRunCommand::DoNotRunExecutable
          (cmTryRunCommand *this,string *runArgs,string *srcFile,string *out)

{
  string *filename;
  string *__lhs;
  _Ios_Openmode _Var1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  cmState *pcVar5;
  ostream *poVar6;
  allocator local_321;
  string errorMessage;
  string local_300;
  string local_2e0;
  string internalRunOutputName;
  string copyDest;
  string detailsString;
  string resultFileName;
  string comment;
  byte abStack_210 [480];
  
  pcVar3 = cmMakefile::GetHomeOutputDirectory
                     ((this->super_cmCoreTryCompile).super_cmCommand.Makefile);
  std::__cxx11::string::string((string *)&copyDest,pcVar3,(allocator *)&comment);
  std::__cxx11::string::append((char *)&copyDest);
  std::__cxx11::string::append((char *)&copyDest);
  filename = &(this->super_cmCoreTryCompile).OutputFile;
  cmsys::SystemTools::GetFilenameWithoutExtension(&comment,filename);
  std::__cxx11::string::append((string *)&copyDest);
  std::__cxx11::string::~string((string *)&comment);
  std::__cxx11::string::append((char *)&copyDest);
  __lhs = &this->RunResultVariable;
  std::__cxx11::string::append((string *)&copyDest);
  cmsys::SystemTools::GetFilenameExtension(&comment,filename);
  std::__cxx11::string::append((string *)&copyDest);
  std::__cxx11::string::~string((string *)&comment);
  cmsys::SystemTools::CopyFileAlways(filename,&copyDest);
  pcVar3 = cmMakefile::GetHomeOutputDirectory
                     ((this->super_cmCoreTryCompile).super_cmCommand.Makefile);
  std::__cxx11::string::string((string *)&resultFileName,pcVar3,(allocator *)&comment);
  std::__cxx11::string::append((char *)&resultFileName);
  std::__cxx11::string::string((string *)&detailsString,"For details see ",(allocator *)&comment);
  std::__cxx11::string::append((string *)&detailsString);
  std::operator+(&internalRunOutputName,__lhs,"__TRYRUN_OUTPUT");
  pcVar3 = cmMakefile::GetDefinition((this->super_cmCoreTryCompile).super_cmCommand.Makefile,__lhs);
  if (pcVar3 == (char *)0x0) {
    comment._M_string_length = 0;
    comment.field_2._M_local_buf[0] = '\0';
    comment._M_dataplus._M_p = (pointer)&comment.field_2;
    std::__cxx11::string::append((char *)&comment);
    std::__cxx11::string::append((string *)&comment);
    cmMakefile::AddCacheDefinition
              ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,__lhs,
               "PLEASE_FILL_OUT-FAILED_TO_RUN",comment._M_dataplus._M_p,STRING,false);
    pcVar5 = cmMakefile::GetState((this->super_cmCoreTryCompile).super_cmCommand.Makefile);
    pcVar4 = cmState::GetCacheEntryValue(pcVar5,__lhs);
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::string((string *)&errorMessage,"ADVANCED",(allocator *)&local_2e0);
      std::__cxx11::string::string((string *)&local_300,"1",&local_321);
      cmState::SetCacheEntryProperty(pcVar5,__lhs,&errorMessage,&local_300);
      std::__cxx11::string::~string((string *)&local_300);
      std::__cxx11::string::~string((string *)&errorMessage);
    }
    std::__cxx11::string::~string((string *)&comment);
    if (out != (string *)0x0) goto LAB_0032eb11;
    bVar2 = true;
  }
  else {
    if (out == (string *)0x0) goto LAB_0032f041;
LAB_0032eb11:
    pcVar4 = cmMakefile::GetDefinition
                       ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,
                        &internalRunOutputName);
    if (pcVar4 == (char *)0x0) {
      comment._M_string_length = 0;
      comment.field_2._M_local_buf[0] = '\0';
      comment._M_dataplus._M_p = (pointer)&comment.field_2;
      std::__cxx11::string::append((char *)&comment);
      std::__cxx11::string::append((string *)&comment);
      cmMakefile::AddCacheDefinition
                ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,&internalRunOutputName,
                 "PLEASE_FILL_OUT-NOTFOUND",comment._M_dataplus._M_p,STRING,false);
      pcVar5 = cmMakefile::GetState((this->super_cmCoreTryCompile).super_cmCommand.Makefile);
      pcVar3 = cmState::GetCacheEntryValue(pcVar5,&internalRunOutputName);
      if (pcVar3 != (char *)0x0) {
        std::__cxx11::string::string((string *)&errorMessage,"ADVANCED",(allocator *)&local_2e0);
        std::__cxx11::string::string((string *)&local_300,"1",&local_321);
        cmState::SetCacheEntryProperty(pcVar5,&internalRunOutputName,&errorMessage,&local_300);
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::string::~string((string *)&errorMessage);
      }
      std::__cxx11::string::~string((string *)&comment);
    }
    else if (pcVar3 != (char *)0x0) {
      cmMakefile::GetDefinition
                ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,&internalRunOutputName);
      std::__cxx11::string::assign((char *)out);
      goto LAB_0032f041;
    }
    bVar2 = false;
  }
  _Var1 = _S_out;
  if (DoNotRunExecutable(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
      ::firstTryRun != '\0') {
    _Var1 = _S_app;
  }
  std::ofstream::ofstream(&comment,resultFileName._M_dataplus._M_p,_Var1);
  if ((abStack_210[*(long *)(comment._M_dataplus._M_p + -0x18)] & 5) == 0) {
    if (DoNotRunExecutable(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
        ::firstTryRun == '\0') {
      std::operator<<((ostream *)&comment,
                      "# This file was generated by CMake because it detected TRY_RUN() commands\n# in crosscompiling mode. It will be overwritten by the next CMake run.\n# Copy it to a safe location, set the variables to appropriate values\n# and use it then to preset the CMake cache (using -C).\n\n"
                     );
    }
    std::__cxx11::string::string((string *)&errorMessage,"\n",(allocator *)&local_300);
    std::__cxx11::string::append((string *)&errorMessage);
    std::__cxx11::string::append((char *)&errorMessage);
    std::__cxx11::string::append((string *)&errorMessage);
    std::__cxx11::string::append((char *)&errorMessage);
    if (!bVar2) {
      std::__cxx11::string::append((string *)&errorMessage);
      std::__cxx11::string::append((char *)&errorMessage);
      std::__cxx11::string::append((string *)&errorMessage);
      std::__cxx11::string::append((char *)&errorMessage);
    }
    std::__cxx11::string::append((char *)&errorMessage);
    std::__cxx11::string::append((string *)&errorMessage);
    std::__cxx11::string::append((char *)&errorMessage);
    std::operator+(&local_300,srcFile,"\n");
    std::__cxx11::string::append((string *)&errorMessage);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::append((char *)&errorMessage);
    std::operator+(&local_300,&copyDest,"\n");
    std::__cxx11::string::append((string *)&errorMessage);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::append((char *)&errorMessage);
    std::__cxx11::string::append((string *)&errorMessage);
    std::__cxx11::string::append((char *)&errorMessage);
    cmMakefile::FormatListFileStack_abi_cxx11_
              (&local_2e0,(this->super_cmCoreTryCompile).super_cmCommand.Makefile);
    std::operator+(&local_300,"   Called from: ",&local_2e0);
    std::__cxx11::string::append((string *)&errorMessage);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
    cmsys::SystemTools::ReplaceString(&errorMessage,"\n","\n# ");
    poVar6 = std::operator<<((ostream *)&comment,(string *)&errorMessage);
    std::operator<<(poVar6,"\n\n");
    poVar6 = std::operator<<((ostream *)&comment,"set( ");
    poVar6 = std::operator<<(poVar6,(string *)__lhs);
    poVar6 = std::operator<<(poVar6," \n     \"");
    pcVar3 = cmMakefile::GetDefinition
                       ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,__lhs);
    poVar6 = std::operator<<(poVar6,pcVar3);
    std::operator<<(poVar6,"\"\n     CACHE STRING \"Result from TRY_RUN\" FORCE)\n\n");
    if (!bVar2) {
      poVar6 = std::operator<<((ostream *)&comment,"set( ");
      poVar6 = std::operator<<(poVar6,(string *)&internalRunOutputName);
      poVar6 = std::operator<<(poVar6," \n     \"");
      pcVar3 = cmMakefile::GetDefinition
                         ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,
                          &internalRunOutputName);
      poVar6 = std::operator<<(poVar6,pcVar3);
      std::operator<<(poVar6,"\"\n     CACHE STRING \"Output from TRY_RUN\" FORCE)\n\n");
    }
    std::ofstream::close();
    std::__cxx11::string::~string((string *)&errorMessage);
  }
  DoNotRunExecutable(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
  ::firstTryRun = '\x01';
  std::__cxx11::string::string
            ((string *)&errorMessage,
             "TRY_RUN() invoked in cross-compiling mode, please set the following cache variables appropriately:\n"
             ,(allocator *)&local_300);
  std::operator+(&local_2e0,"   ",__lhs);
  std::operator+(&local_300,&local_2e0," (advanced)\n");
  std::__cxx11::string::append((string *)&errorMessage);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_2e0);
  if (!bVar2) {
    std::operator+(&local_2e0,"   ",&internalRunOutputName);
    std::operator+(&local_300,&local_2e0," (advanced)\n");
    std::__cxx11::string::append((string *)&errorMessage);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  std::__cxx11::string::append((string *)&errorMessage);
  cmSystemTools::Error(errorMessage._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
  std::__cxx11::string::~string((string *)&errorMessage);
  std::ofstream::~ofstream(&comment);
LAB_0032f041:
  std::__cxx11::string::~string((string *)&internalRunOutputName);
  std::__cxx11::string::~string((string *)&detailsString);
  std::__cxx11::string::~string((string *)&resultFileName);
  std::__cxx11::string::~string((string *)&copyDest);
  return;
}

Assistant:

void cmTryRunCommand::DoNotRunExecutable(const std::string& runArgs,
                                    const std::string& srcFile,
                                    std::string* out
                                    )
{
  // copy the executable out of the CMakeFiles/ directory, so it is not
  // removed at the end of TRY_RUN and the user can run it manually
  // on the target platform.
  std::string copyDest =  this->Makefile->GetHomeOutputDirectory();
  copyDest += cmake::GetCMakeFilesDirectory();
  copyDest += "/";
  copyDest += cmSystemTools::GetFilenameWithoutExtension(
                                                     this->OutputFile);
  copyDest += "-";
  copyDest += this->RunResultVariable;
  copyDest += cmSystemTools::GetFilenameExtension(this->OutputFile);
  cmSystemTools::CopyFileAlways(this->OutputFile, copyDest);

  std::string resultFileName =  this->Makefile->GetHomeOutputDirectory();
  resultFileName += "/TryRunResults.cmake";

  std::string detailsString = "For details see ";
  detailsString += resultFileName;

  std::string internalRunOutputName=this->RunResultVariable+"__TRYRUN_OUTPUT";
  bool error = false;

  if (this->Makefile->GetDefinition(this->RunResultVariable) == 0)
    {
    // if the variables doesn't exist, create it with a helpful error text
    // and mark it as advanced
    std::string comment;
    comment += "Run result of TRY_RUN(), indicates whether the executable "
               "would have been able to run on its target platform.\n";
    comment += detailsString;
    this->Makefile->AddCacheDefinition(this->RunResultVariable,
                                       "PLEASE_FILL_OUT-FAILED_TO_RUN",
                                       comment.c_str(),
                                       cmState::STRING);

    cmState* state = this->Makefile->GetState();
    const char* existingValue
                        = state->GetCacheEntryValue(this->RunResultVariable);
    if (existingValue)
      {
      state->SetCacheEntryProperty(this->RunResultVariable, "ADVANCED", "1");
      }

    error = true;
    }

  // is the output from the executable used ?
  if (out!=0)
    {
    if (this->Makefile->GetDefinition(internalRunOutputName) == 0)
      {
      // if the variables doesn't exist, create it with a helpful error text
      // and mark it as advanced
      std::string comment;
      comment+="Output of TRY_RUN(), contains the text, which the executable "
           "would have printed on stdout and stderr on its target platform.\n";
      comment += detailsString;

      this->Makefile->AddCacheDefinition(internalRunOutputName,
                                         "PLEASE_FILL_OUT-NOTFOUND",
                                         comment.c_str(),
                                         cmState::STRING);
      cmState* state = this->Makefile->GetState();
      const char* existing =
          state->GetCacheEntryValue(internalRunOutputName);
      if (existing)
        {
        state->SetCacheEntryProperty(internalRunOutputName,
                                      "ADVANCED", "1");
        }

      error = true;
      }
    }

  if (error)
    {
    static bool firstTryRun = true;
    cmsys::ofstream file(resultFileName.c_str(),
                                  firstTryRun ? std::ios::out : std::ios::app);
    if ( file )
      {
      if (firstTryRun)
        {
        file << "# This file was generated by CMake because it detected "
                "TRY_RUN() commands\n"
                "# in crosscompiling mode. It will be overwritten by the next "
                "CMake run.\n"
                "# Copy it to a safe location, set the variables to "
                "appropriate values\n"
                "# and use it then to preset the CMake cache (using -C).\n\n";
        }

      std::string comment ="\n";
      comment += this->RunResultVariable;
      comment += "\n   indicates whether the executable would have been able "
                 "to run on its\n"
                 "   target platform. If so, set ";
      comment += this->RunResultVariable;
      comment += " to\n"
                 "   the exit code (in many cases 0 for success), otherwise "
                 "enter \"FAILED_TO_RUN\".\n";
      if (out!=0)
        {
        comment += internalRunOutputName;
        comment += "\n   contains the text the executable "
                   "would have printed on stdout and stderr.\n"
                  "   If the executable would not have been able to run, set ";
        comment += internalRunOutputName;
        comment += " empty.\n"
                   "   Otherwise check if the output is evaluated by the "
                   "calling CMake code. If so,\n"
                   "   check what the source file would have printed when "
                   "called with the given arguments.\n";
        }
      comment += "The ";
      comment += this->CompileResultVariable;
      comment += " variable holds the build result for this TRY_RUN().\n\n"
                 "Source file   : ";
      comment += srcFile + "\n";
      comment += "Executable    : ";
      comment += copyDest + "\n";
      comment += "Run arguments : ";
      comment += runArgs;
      comment += "\n";
      comment += "   Called from: " + this->Makefile->FormatListFileStack();
      cmsys::SystemTools::ReplaceString(comment, "\n", "\n# ");
      file << comment << "\n\n";

      file << "set( " << this->RunResultVariable << " \n     \""
           << this->Makefile->GetDefinition(this->RunResultVariable)
           << "\"\n     CACHE STRING \"Result from TRY_RUN\" FORCE)\n\n";

      if (out!=0)
        {
        file << "set( " << internalRunOutputName << " \n     \""
             << this->Makefile->GetDefinition(internalRunOutputName)
             << "\"\n     CACHE STRING \"Output from TRY_RUN\" FORCE)\n\n";
        }
      file.close();
      }
    firstTryRun = false;

    std::string errorMessage = "TRY_RUN() invoked in cross-compiling mode, "
                               "please set the following cache variables "
                               "appropriately:\n";
    errorMessage += "   " + this->RunResultVariable + " (advanced)\n";
    if (out!=0)
      {
      errorMessage += "   " + internalRunOutputName + " (advanced)\n";
      }
    errorMessage += detailsString;
    cmSystemTools::Error(errorMessage.c_str());
    return;
    }

  if (out!=0)
    {
    (*out) = this->Makefile->GetDefinition(internalRunOutputName);
    }
}